

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * google::protobuf::Append2(char *out,AlphaNum *x1,AlphaNum *x2)

{
  if (x1->piece_size_ != 0) {
    memcpy(out,x1->piece_data_,x1->piece_size_);
    out = out + x1->piece_size_;
  }
  if (x2->piece_size_ != 0) {
    memcpy(out,x2->piece_data_,x2->piece_size_);
    out = out + x2->piece_size_;
  }
  return out;
}

Assistant:

static char *Append2(char *out, const AlphaNum &x1, const AlphaNum &x2) {
  if (x1.size() > 0) {
    memcpy(out, x1.data(), x1.size());
    out += x1.size();
  }
  if (x2.size() > 0) {
    memcpy(out, x2.data(), x2.size());
    out += x2.size();
  }
  return out;
}